

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O2

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_3015a9::import_strings_parser
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          transaction *transaction,string_mapping *names)

{
  string_mapping *unaff_R14;
  transaction<std::unique_lock<mock_mutex>_> *unaff_R15;
  not_null<pstore::database_*> unaff_retaddr;
  callbacks cStack_38;
  not_null<pstore::database_*> local_28;
  
  local_28.ptr_ = (transaction->super_transaction_base).db_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_28);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>
            (unaff_retaddr,unaff_R15,unaff_R14);
  pstore::json::make_parser<pstore::exchange::import_ns::callbacks>
            (__return_storage_ptr__,&cStack_38,none);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cStack_38.context_.
              super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

decltype (auto)
    import_strings_parser (transaction * const transaction,
                           pstore::exchange::import_ns::string_mapping * const names) {
        return make_json_array_parser<pstore::exchange::import_ns::strings_array_members> (
            &transaction->db (), transaction, names);
    }